

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix-test.cc
# Opt level: O1

void __thiscall
SuffixTest_IntSuffixValue_Test::~SuffixTest_IntSuffixValue_Test
          (SuffixTest_IntSuffixValue_Test *this)

{
  (this->super_SuffixTest).super_Test._vptr_Test = (_func_int **)&PTR__SuffixTest_00172b40;
  mp::BasicSuffixSet<std::allocator<char>_>::~BasicSuffixSet(&(this->super_SuffixTest).suffixes_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x48);
  return;
}

Assistant:

TEST_F(SuffixTest, IntSuffixValue) {
  auto s = suffixes_.Add<int>("test", 11, 3);
  s.set_value(0, 42);
  EXPECT_EQ(42, s.value(0));
  s.set_value(2, 0);
  EXPECT_EQ(0, s.value(2));
  EXPECT_ASSERT(s.value(-1), "index out of bounds");
  EXPECT_ASSERT(s.value(3), "index out of bounds");
  EXPECT_ASSERT(s.set_value(-1, 0), "index out of bounds");
  EXPECT_ASSERT(s.set_value(3, 0), "index out of bounds");
}